

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O0

char * ask_user_string(char *szPrompt,char *szDefault)

{
  size_t sVar1;
  char *in_RSI;
  undefined8 in_RDI;
  char enter [1024];
  char *szResult;
  undefined8 uStack_420;
  char local_418 [1024];
  char *local_18;
  char *local_10;
  undefined8 local_8;
  
  uStack_420 = 0x17f566;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_418,0,0x400);
  while( true ) {
    if (local_10 == (char *)0x0) {
      uStack_420 = 0x17f5a8;
      printf("%s: ",local_8);
    }
    else {
      uStack_420 = 0x17f590;
      printf("%s <%s>: ",local_8,local_10);
    }
    uStack_420 = 0x17f5bf;
    fgets(local_418,0x3ff,_stdin);
    if (((local_418[0] == '\0') || (local_418[0] == '\n')) && (local_10 != (char *)0x0)) break;
    if (((local_418[0] != '\0') && (local_418[0] != '\n')) || (local_10 != (char *)0x0)) {
      uStack_420 = 0x17f64a;
      sVar1 = strlen(local_418);
      if (local_418[sVar1 - 1] == '\n') {
        uStack_420 = 0x17f663;
        sVar1 = strlen(local_418);
        local_418[sVar1 - 1] = '\0';
      }
      uStack_420 = 0x17f673;
      sVar1 = strlen(local_418);
      uStack_420 = 0x17f67f;
      local_18 = (char *)operator_new__(sVar1 + 1);
      uStack_420 = 0x17f697;
      strcpy(local_18,local_418);
      return local_18;
    }
  }
  uStack_420 = 0x17f5ef;
  sVar1 = strlen(local_10);
  uStack_420 = 0x17f5fb;
  local_18 = (char *)operator_new__(sVar1 + 1);
  uStack_420 = 0x17f618;
  strcpy(local_18,local_10);
  return local_18;
}

Assistant:

char*
ask_user_string (const char* szPrompt, const char* szDefault)
{
    char    *szResult;
    char    enter[1024] = "";
 repeat_enter:
    if(NULL != szDefault)
      printf("%s <%s>: ", szPrompt, szDefault);
    else
      printf("%s: ", szPrompt);
    fgets(enter, sizeof(enter)-1, stdin);
    if(('\0' == enter[0] || '\n' == enter[0]) && NULL != szDefault)
      {
	szResult = new char[strlen(szDefault) + 1];
	strcpy(szResult, szDefault);
      }
    else if(('\0' == enter[0] || '\n' == enter[0]) && NULL == szDefault)
      {
	/* default value is not provided - repeat enter */
	goto repeat_enter;
      }
    else
      {
	if('\n' == enter[strlen(enter)-1])
	  enter[strlen(enter)-1] = '\0';
	szResult = new char[strlen(enter) + 1];
	strcpy(szResult, enter);
      }
    return szResult;
}